

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O0

int lj_cf_debug_getlocal(lua_State *L)

{
  undefined8 L_00;
  lua_State *L_01;
  int32_t n;
  int32_t level;
  int iVar1;
  char *pcVar2;
  int slot;
  char *name;
  lua_Debug ar;
  lua_State *L1;
  lua_State *plStack_18;
  int arg;
  lua_State *L_local;
  
  plStack_18 = L;
  ar._112_8_ = getthread(L,(int *)((long)&L1 + 4));
  n = lj_lib_checkint(plStack_18,L1._4_4_ + 2);
  L_01 = plStack_18;
  L_00 = ar._112_8_;
  if ((int)plStack_18->base[L1._4_4_].field_4.it >> 0xf == -9) {
    plStack_18->top = plStack_18->base + (long)L1._4_4_ + 1;
    pcVar2 = lua_getlocal(plStack_18,(lua_Debug *)0x0,n);
    lua_pushstring(L_01,pcVar2);
    L_local._4_4_ = 1;
  }
  else {
    level = lj_lib_checkint(plStack_18,L1._4_4_ + 1);
    iVar1 = lua_getstack((lua_State *)L_00,level,(lua_Debug *)&name);
    if (iVar1 == 0) {
      lj_err_arg(plStack_18,L1._4_4_ + 1,LJ_ERR_LVLRNG);
    }
    pcVar2 = lua_getlocal((lua_State *)ar._112_8_,(lua_Debug *)&name,n);
    if (pcVar2 == (char *)0x0) {
      plStack_18->top[-1].u64 = 0xffffffffffffffff;
      L_local._4_4_ = 1;
    }
    else {
      lua_xmove((lua_State *)ar._112_8_,plStack_18,1);
      lua_pushstring(plStack_18,pcVar2);
      lua_pushvalue(plStack_18,-2);
      L_local._4_4_ = 2;
    }
  }
  return L_local._4_4_;
}

Assistant:

LJLIB_CF(debug_getlocal)
{
  int arg;
  lua_State *L1 = getthread(L, &arg);
  lua_Debug ar;
  const char *name;
  int slot = lj_lib_checkint(L, arg+2);
  if (tvisfunc(L->base+arg)) {
    L->top = L->base+arg+1;
    lua_pushstring(L, lua_getlocal(L, NULL, slot));
    return 1;
  }
  if (!lua_getstack(L1, lj_lib_checkint(L, arg+1), &ar))
    lj_err_arg(L, arg+1, LJ_ERR_LVLRNG);
  name = lua_getlocal(L1, &ar, slot);
  if (name) {
    lua_xmove(L1, L, 1);
    lua_pushstring(L, name);
    lua_pushvalue(L, -2);
    return 2;
  } else {
    setnilV(L->top-1);
    return 1;
  }
}